

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

void sysbvm_function_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"apply",2,0x16,(void *)0x0,sysbvm_function_primitive_apply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"applyWithArguments:",2,0x14,(void *)0x0,
             sysbvm_function_primitive_applyWithArguments);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"applyWithExpandedArguments:",2,0x14,(void *)0x0,
             sysbvm_function_primitive_applyWithExpandedArguments);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"adoptDefinitionOf:",2,4,(void *)0x0,
             sysbvm_function_primitive_adoptDefinitionOf);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"isBootstrapPrimitive",1,0x1c,(void *)0x0,
             sysbvm_function_primitive_isBootstrapPrimitive);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"hasVirtualDispatch",1,0x1c,(void *)0x0,
             sysbvm_function_primitive_hasVirtualDispatch);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"hasOverrideDispatch",1,0x1c,(void *)0x0,
             sysbvm_function_primitive_hasOverrideDispatch);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"recompileAndOptimize",1,4,(void *)0x0,
             sysbvm_function_primitive_recompileAndOptimize);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"recordBindingWithOwner:andName:",3,0x80,
             (void *)0x0,sysbvm_function_primitive_recordBindingWithOwnerAndName);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::None",0xb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Macro",0x1b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Variadic",0x2b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::CorePrimitive",0x4b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Pure",0x8b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Final",0x10b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Virtual",0x20b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Abstract",0x40b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Override",0x80b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::VirtualDispatchFlags",0xe0b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Static",0x100b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Memoized",0x200b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Template",0x400b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::NoTypecheckArguments",0x800b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::AllowReferenceInReceiver",0x1000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::ExternC",0x2000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::DLLImport",0x4000b)
  ;
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::DLLExport",0x8000b)
  ;
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Inline",0x10000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::AlwaysInline",0x10000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::NeverInline",0x40000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::WithoutSourceDebugging",0x100000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::NoGC",0x200000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::NoEscape",0x400000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::TargetDefinedPrimitive",0x80000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::BootstrapPrimitiveKeptFlags",0x8001cb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::TypeFlags",0x602b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionApplicationFlags::None",0xb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionApplicationFlags::NoTypecheck",0x1b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionApplicationFlags::VariadicExpanded",0x2b);
  return;
}

Assistant:

void sysbvm_function_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "apply", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VARIADIC | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_apply);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "applyWithArguments:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_applyWithArguments);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "applyWithExpandedArguments:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_applyWithExpandedArguments);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "adoptDefinitionOf:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_function_primitive_adoptDefinitionOf);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "isBootstrapPrimitive", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_isBootstrapPrimitive);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "hasVirtualDispatch", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_hasVirtualDispatch);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "hasOverrideDispatch", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_hasOverrideDispatch);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "recompileAndOptimize", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_function_primitive_recompileAndOptimize);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "recordBindingWithOwner:andName:", 3, SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_function_primitive_recordBindingWithOwnerAndName);

    // Export the function flags.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::None", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NONE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Macro", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_MACRO));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Variadic", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_VARIADIC));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::CorePrimitive", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Pure", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_PURE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Final", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_FINAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Virtual", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_VIRTUAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Abstract", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_ABSTRACT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Override", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_OVERRIDE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::VirtualDispatchFlags", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_VIRTUAL_DISPATCH_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Static", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_STATIC));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Memoized", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_MEMOIZED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Template", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_TEMPLATE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NoTypecheckArguments", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NO_TYPECHECK_ARGUMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::AllowReferenceInReceiver", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_ALLOW_REFERENCE_IN_RECEIVER));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::ExternC", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_EXTERN_C));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::DLLImport", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_DLLIMPORT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::DLLExport", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_DLLEXPORT));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Inline", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_INLINE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::AlwaysInline", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_INLINE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NeverInline", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NEVER_INLINE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::WithoutSourceDebugging", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NoGC", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NOGC));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NoEscape", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NOESCAPE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::TargetDefinedPrimitive", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::BootstrapPrimitiveKeptFlags", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_BOOTSTRAP_PRIMITIVE_KEPT_FLAGS));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::TypeFlags", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_TYPE_FLAGS));

    // Export the function application flags.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionApplicationFlags::None", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_APPLICATION_FLAGS_NONE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionApplicationFlags::NoTypecheck", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionApplicationFlags::VariadicExpanded", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED));
}